

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_deflate_prime.cc
# Opt level: O0

void __thiscall deflate_prime_Test::TestBody(deflate_prime_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int err;
  uint32_t crc;
  size_t uncompr_len;
  size_t compr_len;
  uint8_t uncompr [128];
  uint8_t compr [128];
  zng_stream d_stream;
  zng_stream c_stream;
  zng_stream *in_stack_fffffffffffff9e8;
  zng_stream *in_stack_fffffffffffff9f0;
  AssertionResult *pAVar6;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  char *in_stack_fffffffffffffa00;
  zng_stream *in_stack_fffffffffffffa08;
  int iVar7;
  int32_t in_stack_fffffffffffffa10;
  int32_t in_stack_fffffffffffffa14;
  undefined4 uVar8;
  zng_stream *in_stack_fffffffffffffa18;
  Type type;
  AssertHelper *in_stack_fffffffffffffa20;
  AssertionResult *pAVar9;
  undefined8 in_stack_fffffffffffffa30;
  int32_t flush;
  zng_stream *in_stack_fffffffffffffa38;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffa58;
  char *in_stack_fffffffffffffa60;
  Message *in_stack_fffffffffffffa68;
  AssertionResult *pAVar10;
  undefined7 in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa77;
  int32_t flush_00;
  undefined7 in_stack_fffffffffffffab8;
  AssertionResult local_478 [2];
  undefined4 local_454;
  AssertionResult local_450 [2];
  undefined4 local_42c;
  AssertionResult local_428 [2];
  undefined4 local_404;
  AssertionResult local_400 [2];
  undefined4 local_3dc;
  AssertionResult local_3d8 [2];
  undefined4 local_3b4;
  AssertionResult local_3b0 [2];
  undefined4 local_38c;
  AssertionResult local_388 [2];
  undefined4 local_364;
  AssertionResult local_360 [2];
  undefined4 local_33c;
  AssertionResult local_338 [2];
  undefined4 local_314;
  AssertionResult local_310 [2];
  undefined4 local_2ec;
  AssertionResult local_2e8 [2];
  undefined4 local_2c4;
  AssertionResult local_2c0 [2];
  undefined4 local_29c;
  AssertionResult local_298 [2];
  undefined4 local_274;
  AssertionResult local_270 [2];
  undefined4 local_24c;
  AssertionResult local_248 [3];
  undefined4 local_214;
  AssertionResult local_210;
  int32_t local_200;
  uint32_t local_1fc;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [128];
  undefined1 local_168 [128];
  undefined1 *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 *puStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 *puStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  flush = (int32_t)((ulong)in_stack_fffffffffffffa30 >> 0x20);
  local_1f0 = 0x80;
  local_1f8 = 0x80;
  local_1fc = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  puStack_60 = (undefined1 *)0x0;
  local_78 = (char *)0x0;
  uStack_70 = 0;
  local_18 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  puStack_d0 = (undefined1 *)0x0;
  local_e8 = (undefined1 *)0x0;
  uStack_e0 = 0;
  local_88 = 0;
  local_200 = zng_deflateInit2(in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
                               in_stack_fffffffffffffa10,
                               (int32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                               (int32_t)in_stack_fffffffffffffa08,
                               (int32_t)((ulong)in_stack_fffffffffffffa00 >> 0x20));
  type = (Type)((ulong)in_stack_fffffffffffffa18 >> 0x20);
  local_214 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x130a0a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
               in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x130a6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130ac5);
  local_200 = zng_deflatePrime(in_stack_fffffffffffffa08,
                               (int32_t)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                               (int32_t)in_stack_fffffffffffffa00);
  local_24c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x130b90);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
               in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x130bf3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130c4b);
  local_200 = zng_deflatePrime(in_stack_fffffffffffffa08,
                               (int32_t)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                               (int32_t)in_stack_fffffffffffffa00);
  local_274 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_270);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x130d13);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
               in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x130d76);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130dce);
  local_200 = zng_deflatePrime(in_stack_fffffffffffffa08,
                               (int32_t)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                               (int32_t)in_stack_fffffffffffffa00);
  local_29c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x130e96);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
               in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x130ef9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130f51);
  local_200 = zng_deflatePrime(in_stack_fffffffffffffa08,
                               (int32_t)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                               (int32_t)in_stack_fffffffffffffa00);
  local_2c4 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x131019);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
               in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x13107c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1310d4);
  local_200 = deflate_prime_32(in_stack_fffffffffffff9f0,
                               (uint32_t)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
  local_2ec = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x131197);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
               in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x1311fa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131252);
  local_200 = zng_deflatePrime(in_stack_fffffffffffffa08,
                               (int32_t)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                               (int32_t)in_stack_fffffffffffffa00);
  local_314 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x13131a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
               in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x13137d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1313d5);
  local_200 = zng_deflatePrime(in_stack_fffffffffffffa08,
                               (int32_t)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                               (int32_t)in_stack_fffffffffffffa00);
  local_33c = 0;
  pAVar10 = local_338;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar10);
  flush_00 = (int32_t)((ulong)pAVar10 >> 0x20);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x1314a0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
               in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x131503);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13155b);
  local_78 = "hello, hello!";
  uStack_70 = CONCAT44(uStack_70._4_4_,0xe);
  puStack_60 = local_168;
  local_58 = CONCAT44(local_58._4_4_,(undefined4)local_1f0);
  local_200 = zng_deflate(in_stack_fffffffffffffa38,flush);
  local_364 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_360);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x131659);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
               in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x1316bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131714);
  local_1fc = zng_crc32((uint32_t)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                        (uchar *)in_stack_fffffffffffff9e8,0);
  local_200 = deflate_prime_32(in_stack_fffffffffffff9f0,
                               (uint32_t)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
  local_38c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_388);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x1317f6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
               in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x131859);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1318b1);
  local_200 = deflate_prime_32(in_stack_fffffffffffff9f0,
                               (uint32_t)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
  local_3b4 = 0;
  pAVar10 = local_3b0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar10);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    in_stack_fffffffffffffa60 =
         testing::AssertionResult::failure_message((AssertionResult *)0x131977);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffa70),(Message *)pAVar10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x1319d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131a29);
  local_200 = zng_deflateEnd(in_stack_fffffffffffff9e8);
  local_3dc = 0;
  this_00 = local_3d8;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x131ade);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffa70),(Message *)pAVar10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x131b3b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131b93);
  local_e8 = local_168;
  uStack_e0 = CONCAT44(uStack_e0._4_4_,(undefined4)uStack_50);
  puStack_d0 = local_1e8;
  local_c8 = CONCAT44(local_c8._4_4_,(undefined4)local_1f8);
  local_d8 = 0;
  uStack_c0 = 0;
  local_200 = zng_inflateInit2(in_stack_fffffffffffffa08,
                               (int32_t)((ulong)in_stack_fffffffffffffa00 >> 0x20));
  local_404 = 0;
  pAVar9 = local_400;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::AssertionResult::failure_message((AssertionResult *)0x131ca1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffa70),(Message *)pAVar10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x131cfe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131d56);
  local_200 = zng_inflate((zng_stream *)CONCAT17(uVar2,in_stack_fffffffffffffab8),flush_00);
  local_42c = 0xfffffffb;
  pAVar9 = local_428;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  iVar7 = (int)((ulong)in_stack_fffffffffffffa08 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  if (!bVar1) {
    testing::Message::Message((Message *)pAVar9);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x131e10);
    type = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)pAVar9,type,
               (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),iVar7,
               in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffa70),(Message *)pAVar10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x131e6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131ec2);
  local_200 = zng_inflateEnd(in_stack_fffffffffffff9e8);
  local_454 = 0;
  pAVar6 = local_450;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&pAVar6->success_,in_stack_fffffffffffffa00,
             (int *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
             (int *)in_stack_fffffffffffff9f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  iVar7 = (int)((ulong)pAVar6 >> 0x20);
  uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa14);
  if (!bVar1) {
    testing::Message::Message((Message *)pAVar9);
    in_stack_fffffffffffffa00 =
         testing::AssertionResult::failure_message((AssertionResult *)0x131f77);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)pAVar9,type,(char *)CONCAT44(uVar8,in_stack_fffffffffffffa10),iVar7,
               in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffa70),(Message *)pAVar10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    testing::Message::~Message((Message *)0x131fd4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x132029);
  pAVar6 = local_478;
  testing::internal::CmpHelperSTREQ
            (&pAVar10->success_,in_stack_fffffffffffffa60,
             (char *)CONCAT17(uVar4,in_stack_fffffffffffffa58),&this_00->success_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  if (!bVar1) {
    testing::Message::Message((Message *)pAVar9);
    testing::AssertionResult::failure_message((AssertionResult *)0x1320be);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)pAVar9,type,(char *)CONCAT44(uVar8,in_stack_fffffffffffffa10),iVar7,
               in_stack_fffffffffffffa00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffa70),(Message *)pAVar10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar6);
    testing::Message::~Message((Message *)0x132119);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13216e);
  return;
}

Assistant:

TEST(deflate, prime) {
    PREFIX3(stream) c_stream, d_stream;
    uint8_t compr[128], uncompr[128];
    z_size_t compr_len = sizeof(compr), uncompr_len = sizeof(uncompr);
    uint32_t crc = 0;
    int err;

    memset(&c_stream, 0, sizeof(c_stream));
    memset(&d_stream, 0, sizeof(d_stream));

    /* Raw deflate windowBits is -15 */
    err = PREFIX(deflateInit2)(&c_stream, Z_DEFAULT_COMPRESSION, Z_DEFLATED, -MAX_WBITS, 8, Z_DEFAULT_STRATEGY);
    EXPECT_EQ(err, Z_OK);

    /* Gzip magic number */
    err = PREFIX(deflatePrime)(&c_stream, 16, 0x8b1f);
    EXPECT_EQ(err, Z_OK);
    /* Gzip compression method (deflate) */
    err = PREFIX(deflatePrime)(&c_stream, 8, 0x08);
    EXPECT_EQ(err, Z_OK);
    /* Gzip flags (one byte, using two odd bit calls) */
    err = PREFIX(deflatePrime)(&c_stream, 3, 0x0);
    EXPECT_EQ(err, Z_OK);
    err = PREFIX(deflatePrime)(&c_stream, 5, 0x0);
    EXPECT_EQ(err, Z_OK);
    /* Gzip modified time */
    err = deflate_prime_32(&c_stream, 0x0);
    EXPECT_EQ(err, Z_OK);
    /* Gzip extra flags */
    err = PREFIX(deflatePrime)(&c_stream, 8, 0x0);
    EXPECT_EQ(err, Z_OK);
    /* Gzip operating system */
    err = PREFIX(deflatePrime)(&c_stream, 8, 255);
    EXPECT_EQ(err, Z_OK);

    c_stream.next_in = (z_const unsigned char *)hello;
    c_stream.avail_in = (uint32_t)hello_len;
    c_stream.next_out = compr;
    c_stream.avail_out = (uint32_t)compr_len;

    err = PREFIX(deflate)(&c_stream, Z_FINISH);
    EXPECT_EQ(err, Z_STREAM_END);

    /* Gzip uncompressed data crc32 */
    crc = PREFIX(crc32)(0, (const uint8_t *)hello, (uint32_t)hello_len);
    err = deflate_prime_32(&c_stream, crc);
    EXPECT_EQ(err, Z_OK);
    /* Gzip uncompressed data length */
    err = deflate_prime_32(&c_stream, (uint32_t)hello_len);
    EXPECT_EQ(err, Z_OK);

    err = PREFIX(deflateEnd)(&c_stream);
    EXPECT_EQ(err, Z_OK);

    d_stream.next_in  = compr;
    d_stream.avail_in = (uint32_t)c_stream.total_out;
    d_stream.next_out = uncompr;
    d_stream.avail_out = (uint32_t)uncompr_len;
    d_stream.total_in = 0;
    d_stream.total_out = 0;

    /* Inflate with gzip header */
    err = PREFIX(inflateInit2)(&d_stream, MAX_WBITS + 32);
    EXPECT_EQ(err, Z_OK);

    err = PREFIX(inflate)(&d_stream, Z_FINISH);
    EXPECT_EQ(err, Z_BUF_ERROR);

    err = PREFIX(inflateEnd)(&d_stream);
    EXPECT_EQ(err, Z_OK);

    EXPECT_STREQ((char *)uncompr, hello);
}